

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeRTASParallelOperationCreateExp
          (ze_driver_handle_t hDriver,ze_rtas_parallel_operation_exp_handle_t *phParallelOperation)

{
  ze_pfnRTASParallelOperationCreateExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_rtas_parallel_operation_exp_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hDriver + 8);
  p_Var1 = (local_10->ze).RTASParallelOperationExp.pfnCreateExp;
  if (p_Var1 == (ze_pfnRTASParallelOperationCreateExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_driver_handle_t *)hDriver,phParallelOperation);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t*>,_ze_rtas_parallel_operation_exp_handle_t*>
               ::getInstance<_ze_rtas_parallel_operation_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t*>,_ze_rtas_parallel_operation_exp_handle_t*>
                           *)(context + 0x6c0),phParallelOperation,&local_10);
      *phParallelOperation = (ze_rtas_parallel_operation_exp_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationCreateExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_parallel_operation_exp_handle_t* phParallelOperation///< [out] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnCreateExp = dditable->ze.RTASParallelOperationExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnCreateExp( hDriver, phParallelOperation );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_exp_handle_t>(
                context->ze_rtas_parallel_operation_exp_factory.getInstance( *phParallelOperation, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }